

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* rlib::operator<<(std::ostream&,rlib::JsonT<void>::Stringify_const&)::F::getReplaceStringRegex(std
  ::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::
  __cxx11::string,std::__cxx11::string_>_>_>_const__
            (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *t)

{
  pointer ppVar1;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar2;
  long *plVar3;
  _AutomatonPtr *p_Var4;
  pointer __rhs;
  string re;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  __rhs = (t->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (t->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = __return_storage_ptr__;
  if (__rhs != ppVar1) {
    do {
      std::operator+(&local_50,"(",&__rhs->first);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      p_Var4 = (_AutomatonPtr *)(plVar3 + 2);
      if ((_AutomatonPtr *)*plVar3 == p_Var4) {
        local_b8._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (p_Var4->
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        local_b8._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[3];
        local_b8._0_8_ = &local_b8._M_automaton;
      }
      else {
        local_b8._M_automaton.
        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (p_Var4->
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        local_b8._0_8_ = (_AutomatonPtr *)*plVar3;
      }
      local_b8._8_8_ = plVar3[1];
      *plVar3 = (long)p_Var4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_98,local_b8._0_8_);
      if ((_AutomatonPtr *)local_b8._0_8_ != &local_b8._M_automaton) {
        operator_delete((void *)local_b8._0_8_,
                        (ulong)((long)&((local_b8._M_automaton.
                                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super__NFA_base)._M_paren_stack.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,&__rhs->second);
      __rhs = __rhs + 1;
    } while (__rhs != ppVar1);
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_b8,&local_98,0x10);
  ppVar2 = local_58;
  std::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
            (local_58,&local_b8,&local_78);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return ppVar2;
}

Assistant:

static std::pair<std::regex, std::vector<string>> getReplaceStringRegex(const std::vector<std::pair<string, string>>& t) {
					assert(!t.empty());
					std::vector<string> v;
					string re;
					for (auto& i : t) {
						re += "(" + i.first + ")|";
						v.push_back(i.second);
					}
					re.pop_back();	// 末尾の "|" を削除
					return { std::regex(re) ,v };
				}